

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O2

void __thiscall
cmMakefile::SetGlobalTargetImportScope::SetGlobalTargetImportScope
          (SetGlobalTargetImportScope *this,cmMakefile *mk,ImportedTargetScope scope)

{
  bool bVar1;
  
  this->Makefile = mk;
  if (scope == Global) {
    bVar1 = IsImportedTargetGlobalScope(mk);
    if (!bVar1) {
      this->Makefile->CurrentImportedTargetScope = Global;
      bVar1 = true;
      goto LAB_00294313;
    }
  }
  bVar1 = false;
LAB_00294313:
  this->Set = bVar1;
  return;
}

Assistant:

SetGlobalTargetImportScope(cmMakefile* mk, ImportedTargetScope const scope)
      : Makefile(mk)
    {
      if (scope == ImportedTargetScope::Global &&
          !this->Makefile->IsImportedTargetGlobalScope()) {
        this->Makefile->CurrentImportedTargetScope = scope;
        this->Set = true;
      } else {
        this->Set = false;
      }
    }